

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_cell_id_tec
          (REF_NODE ref_node,REF_CELL ref_cell,REF_INT cell_id,REF_LONG ncell_expected,REF_GLOB *l2c
          ,REF_BOOL binary,FILE *file)

{
  long *plVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  REF_MPI ref_mpi;
  size_t sVar11;
  REF_INT source;
  char *pcVar12;
  int iVar13;
  size_t __n;
  ulong uVar14;
  REF_INT ncell;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB globals [27];
  int local_1c4;
  void *local_1c0;
  int local_1b4;
  size_t local_1b0;
  REF_MPI local_1a8;
  REF_BOOL local_19c;
  void *local_198;
  REF_NODE local_190;
  void *local_188;
  size_t local_180;
  REF_INT local_178 [28];
  REF_GLOB aRStack_108 [27];
  
  local_1a8 = ref_node->ref_mpi;
  uVar2 = ref_cell->node_per;
  uVar14 = (ulong)uVar2;
  iVar9 = ref_cell->max;
  local_1c0 = (void *)CONCAT44(local_1c0._4_4_,cell_id);
  local_190 = ref_node;
  local_180 = ncell_expected;
  if (local_1a8->id == 0) {
    local_19c = binary;
    if (iVar9 < 1) {
      local_1b0 = 0;
    }
    else {
      iVar13 = 0;
      local_1b0 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar13,local_178);
        if ((RVar3 == 0) && (local_178[ref_cell->node_per] == cell_id)) {
          uVar4 = ref_cell_part(ref_cell,local_190,iVar13,&local_1b4);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar7 = 0x28c;
            goto LAB_0013746c;
          }
          if (local_1a8->id == local_1b4) {
            if ((int)uVar2 < 1) {
              if (local_19c == 0) goto LAB_00137597;
            }
            else {
              uVar8 = 0;
              do {
                aRStack_108[uVar8] = l2c[local_178[uVar8]];
                uVar8 = uVar8 + 1;
              } while (uVar14 != uVar8);
              if (local_19c == 0) {
                if (0 < (int)uVar2) {
                  uVar8 = 0;
                  do {
                    aRStack_108[uVar8] = aRStack_108[uVar8] + 1;
                    fprintf((FILE *)file," %ld");
                    uVar8 = uVar8 + 1;
                  } while (uVar14 != uVar8);
                }
LAB_00137597:
                fputc(10,(FILE *)file);
              }
              else if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  local_1c4 = (int)aRStack_108[uVar8];
                  sVar5 = fwrite(&local_1c4,4,1,(FILE *)file);
                  if (sVar5 != 1) {
                    pcVar12 = "int c2n";
                    __n = 1;
                    uVar7 = 0x295;
                    goto LAB_001379c7;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar14 != uVar8);
              }
            }
            local_1b0 = local_1b0 + 1;
          }
          cell_id = (int)local_1c0;
        }
        iVar13 = iVar13 + 1;
        iVar9 = ref_cell->max;
      } while (iVar13 < iVar9);
      if (local_1a8->id != 0) goto LAB_001373bb;
    }
    ref_mpi = local_1a8;
    sVar11 = local_1b0;
    if (1 < local_1a8->n) {
      local_190 = (REF_NODE)(uVar14 * 8);
      source = 1;
      do {
        local_198 = (void *)CONCAT44(local_198._4_4_,source);
        uVar4 = ref_mpi_gather_recv(ref_mpi,&local_1c4,1,1,source);
        if (uVar4 != 0) {
          pcVar12 = "recv ncell";
          uVar7 = 0x2a7;
          goto LAB_0013746c;
        }
        uVar4 = local_1c4 * uVar2;
        if ((int)uVar4 < 0) {
          uVar7 = 0x2a8;
          goto LAB_001378a9;
        }
        local_1c0 = malloc((ulong)uVar4 * 8);
        if (local_1c0 == (void *)0x0) {
          pcVar12 = "malloc c2n of REF_GLOB NULL";
          uVar7 = 0x2a8;
          goto LAB_00137a95;
        }
        pvVar6 = malloc((ulong)uVar4 << 2);
        ref_mpi = local_1a8;
        if (pvVar6 == (void *)0x0) {
          pcVar12 = "malloc int_c2n of REF_INT NULL";
          uVar7 = 0x2a9;
          goto LAB_00137a95;
        }
        local_188 = pvVar6;
        uVar4 = ref_mpi_gather_recv(local_1a8,local_1c0,uVar4,2,(REF_INT)local_198);
        if (uVar4 != 0) {
          pcVar12 = "recv c2n";
          uVar7 = 0x2ac;
          goto LAB_0013746c;
        }
        uVar4 = local_1c4 * uVar2;
        if (local_19c == 0) {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              plVar1 = (long *)((long)local_1c0 + uVar8 * 8);
              *plVar1 = *plVar1 + 1;
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          if (0 < local_1c4) {
            lVar10 = 0;
            pvVar6 = local_1c0;
            local_1b0 = sVar11;
            do {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  fprintf((FILE *)file," %ld",*(undefined8 *)((long)pvVar6 + uVar8 * 8));
                  uVar8 = uVar8 + 1;
                } while (uVar14 != uVar8);
              }
              fputc(10,(FILE *)file);
              lVar10 = lVar10 + 1;
              pvVar6 = (void *)((long)pvVar6 + (long)local_190);
              ref_mpi = local_1a8;
              sVar11 = local_1b0;
            } while (lVar10 < local_1c4);
          }
        }
        else {
          if (0 < (int)uVar4) {
            uVar8 = 0;
            do {
              *(undefined4 *)((long)local_188 + uVar8 * 4) =
                   *(undefined4 *)((long)local_1c0 + uVar8 * 8);
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
          __n = (size_t)(int)uVar4;
          sVar5 = fwrite(local_188,4,__n,(FILE *)file);
          if (sVar5 != __n) {
            pcVar12 = "int c2n";
            uVar7 = 0x2b4;
            goto LAB_001379c7;
          }
        }
        pvVar6 = local_1c0;
        sVar11 = sVar11 + (long)local_1c4;
        free(local_188);
        free(pvVar6);
        source = (REF_INT)local_198 + 1;
      } while (source < ref_mpi->n);
    }
LAB_00137987:
    if (ref_mpi->id != 0) {
      return 0;
    }
    if (sVar11 == local_180) {
      return 0;
    }
    pcVar12 = "cell count mismatch";
    uVar7 = 0x2e1;
    __n = local_180;
    sVar5 = sVar11;
LAB_001379c7:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_cell_id_tec",pcVar12,__n,sVar5);
LAB_001379ce:
    uVar4 = 1;
  }
  else {
    local_1b0 = 0;
LAB_001373bb:
    local_1c4 = 0;
    if (0 < iVar9) {
      iVar9 = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,iVar9,local_178);
        if ((RVar3 == 0) && (local_178[ref_cell->node_per] == cell_id)) {
          uVar4 = ref_cell_part(ref_cell,local_190,iVar9,&local_1b4);
          if (uVar4 != 0) {
            pcVar12 = "part";
            uVar7 = 0x2c9;
            goto LAB_0013746c;
          }
          cell_id = (int)local_1c0;
          if (local_1a8->id == local_1b4) {
            local_1c4 = local_1c4 + 1;
          }
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < ref_cell->max);
    }
    ref_mpi = local_1a8;
    uVar4 = ref_mpi_gather_send(local_1a8,&local_1c4,1,1);
    if (uVar4 == 0) {
      if ((int)(local_1c4 * uVar2) < 0) {
        uVar7 = 0x2ce;
LAB_001378a9:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar7,"ref_gather_cell_id_tec","malloc c2n of REF_GLOB negative");
        goto LAB_001379ce;
      }
      pvVar6 = malloc((ulong)(local_1c4 * uVar2) << 3);
      if (pvVar6 == (void *)0x0) {
        pcVar12 = "malloc c2n of REF_GLOB NULL";
        uVar7 = 0x2ce;
LAB_00137a95:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar7,"ref_gather_cell_id_tec",pcVar12);
        return 2;
      }
      local_1c4 = 0;
      if (0 < ref_cell->max) {
        iVar13 = 0;
        iVar9 = (int)local_1c0;
        local_198 = pvVar6;
        do {
          RVar3 = ref_cell_nodes(ref_cell,iVar13,local_178);
          if ((RVar3 == 0) && (local_178[ref_cell->node_per] == iVar9)) {
            uVar4 = ref_cell_part(ref_cell,local_190,iVar13,&local_1b4);
            if (uVar4 != 0) {
              pcVar12 = "part";
              uVar7 = 0x2d2;
              goto LAB_0013746c;
            }
            iVar9 = (int)local_1c0;
            if (local_1a8->id == local_1b4) {
              if (0 < (int)uVar2) {
                uVar8 = 0;
                do {
                  *(REF_GLOB *)((long)local_198 + uVar8 * 8 + (long)(int)(local_1c4 * uVar2) * 8) =
                       l2c[local_178[uVar8]];
                  uVar8 = uVar8 + 1;
                } while (uVar14 != uVar8);
              }
              local_1c4 = local_1c4 + 1;
            }
          }
          iVar13 = iVar13 + 1;
          ref_mpi = local_1a8;
          pvVar6 = local_198;
        } while (iVar13 < ref_cell->max);
      }
      uVar4 = ref_mpi_gather_send(ref_mpi,pvVar6,uVar2 * local_1c4,2);
      sVar11 = local_1b0;
      if (uVar4 == 0) {
        free(pvVar6);
        goto LAB_00137987;
      }
      pcVar12 = "send c2n";
      uVar7 = 0x2db;
    }
    else {
      pcVar12 = "send ncell";
      uVar7 = 0x2cd;
    }
LAB_0013746c:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_cell_id_tec",(ulong)uVar4,pcVar12);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell_id_tec(
    REF_NODE ref_node, REF_CELL ref_cell, REF_INT cell_id,
    REF_LONG ncell_expected, REF_GLOB *l2c, REF_BOOL binary, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_GLOB globals[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_GLOB *c2n;
  REF_INT *int_c2n;
  REF_INT proc, part, ncell;
  REF_LONG ncell_actual;

  ncell_actual = 0;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++) {
            globals[node] = l2c[nodes[node]];
          }
          if (binary) {
            for (node = 0; node < node_per; node++) {
              int int_node;
              int_node = (int)globals[node]; /* binary zero-based */
              REIS(1, fwrite(&int_node, sizeof(int), 1, file), "int c2n");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              globals[node]++; /* ascii one-based */
              fprintf(file, " " REF_GLOB_FMT, globals[node]);
            }
            fprintf(file, "\n");
          }
          ncell_actual++;
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      ref_malloc(c2n, ncell * node_per, REF_GLOB);
      ref_malloc(int_c2n, ncell * node_per, REF_INT);
      RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE,
                              proc),
          "recv c2n");

      if (binary) { /* binary 0-based int, ASCII 1-based */
        for (cell = 0; cell < ncell * node_per; cell++) {
          int_c2n[cell] = (REF_INT)c2n[cell];
        }
        REIS(ncell * node_per,
             fwrite(int_c2n, sizeof(int), (size_t)(ncell * node_per), file),
             "int c2n");
      } else {
        for (cell = 0; cell < ncell * node_per; cell++) {
          c2n[cell]++;
        }
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++) {
            fprintf(file, " " REF_GLOB_FMT, c2n[node + node_per * cell]);
          }
          fprintf(file, "\n");
        }
      }
      ncell_actual += ncell;

      ref_free(int_c2n);
      ref_free(c2n);
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) ncell++;
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    ref_malloc(c2n, ncell * node_per, REF_GLOB);
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part) {
          for (node = 0; node < node_per; node++)
            c2n[node + node_per * ncell] = l2c[nodes[node]];
          ncell++;
        }
      }
    }
    RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * node_per, REF_GLOB_TYPE),
        "send c2n");

    ref_free(c2n);
  }

  if (ref_mpi_once(ref_mpi)) {
    REIS(ncell_expected, ncell_actual, "cell count mismatch");
  }

  return REF_SUCCESS;
}